

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 953_alienDictionary.cpp
# Opt level: O0

bool isAlienSorted(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *words,string *order)

{
  bool bVar1;
  mapped_type mVar2;
  ulong uVar3;
  key_type *__k;
  mapped_type *pmVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> local_118;
  string local_e8;
  string local_c8;
  int local_a8;
  int i_1;
  ulong local_98;
  size_t i;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> m;
  string word2;
  string word1;
  string *order_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *words_local;
  
  std::__cxx11::string::string((string *)(word2.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&m._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
            ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)&i);
  local_98 = 0;
  while( true ) {
    uVar5 = local_98;
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= uVar5) break;
    mVar2 = (mapped_type)local_98;
    __k = (key_type *)std::__cxx11::string::operator[]((ulong)order);
    pmVar4 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[]((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                         *)&i,__k);
    *pmVar4 = mVar2;
    local_98 = local_98 + 1;
  }
  local_a8 = 0;
  do {
    uVar5 = (ulong)local_a8;
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(words);
    if (sVar6 - 1 <= uVar5) {
      words_local._7_1_ = true;
LAB_001077a1:
      std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::~map
                ((map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)&i
                );
      std::__cxx11::string::~string((string *)&m._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::string::~string((string *)(word2.field_2._M_local_buf + 8));
      return words_local._7_1_;
    }
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](words,(long)local_a8);
    std::__cxx11::string::operator=((string *)(word2.field_2._M_local_buf + 8),(string *)pvVar7);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](words,(long)(local_a8 + 1));
    std::__cxx11::string::operator=
              ((string *)&m._M_t._M_impl.super__Rb_tree_header._M_node_count,(string *)pvVar7);
    std::__cxx11::string::string((string *)&local_c8,(string *)(word2.field_2._M_local_buf + 8));
    std::__cxx11::string::string
              ((string *)&local_e8,(string *)&m._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::map
              (&local_118,
               (map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *)&i);
    bVar1 = isAdjacentSorted(&local_c8,&local_e8,&local_118);
    std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::~map
              (&local_118);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      words_local._7_1_ = false;
      goto LAB_001077a1;
    }
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

bool isAlienSorted(vector<string>& words, string order) {
    string word1,word2;
	map<char,int> m;
	for (size_t i=0; i<order.length(); i++)
	{
		m[order[i]] = i;
	}
    for (int i=0; i<words.size()-1; i++)
    {
    	word1 = words[i];
    	word2 = words[i+1];
	    if (!isAdjacentSorted(word1,word2,m))
	    	return false;
    }
    return true;
}